

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::Statistics::Statistics(Statistics *this)

{
  *(undefined ***)this = &PTR__Statistics_024bf7c8;
  (this->max)._M_dataplus._M_p = (pointer)&(this->max).field_2;
  (this->max)._M_string_length = 0;
  (this->max).field_2._M_local_buf[0] = '\0';
  (this->min)._M_dataplus._M_p = (pointer)&(this->min).field_2;
  (this->min)._M_string_length = 0;
  (this->min).field_2._M_local_buf[0] = '\0';
  this->null_count = 0;
  this->distinct_count = 0;
  (this->max_value)._M_dataplus._M_p = (pointer)&(this->max_value).field_2;
  (this->max_value)._M_string_length = 0;
  (this->max_value).field_2._M_local_buf[0] = '\0';
  (this->min_value)._M_dataplus._M_p = (pointer)&(this->min_value).field_2;
  (this->min_value)._M_string_length = 0;
  (this->min_value).field_2._M_local_buf[0] = '\0';
  this->is_max_value_exact = false;
  this->is_min_value_exact = false;
  this->__isset = (_Statistics__isset)0x0;
  return;
}

Assistant:

Statistics::Statistics() noexcept
   : max(),
     min(),
     null_count(0),
     distinct_count(0),
     max_value(),
     min_value(),
     is_max_value_exact(0),
     is_min_value_exact(0) {
}